

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

SegmentMode wabt::interp::anon_unknown_1::ToSegmentMode(uint8_t flags)

{
  undefined4 local_c;
  uint8_t flags_local;
  
  if ((flags & 3) == 3) {
    local_c = Declared;
  }
  else if ((flags & 1) == 1) {
    local_c = Passive;
  }
  else {
    local_c = Active;
  }
  return local_c;
}

Assistant:

SegmentMode ToSegmentMode(uint8_t flags) {
  if ((flags & SegDeclared) == SegDeclared) {
    return SegmentMode::Declared;
  } else if ((flags & SegPassive) == SegPassive) {
    return SegmentMode::Passive;
  } else {
    return SegmentMode::Active;
  }
}